

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O0

int ktx::validateIOStream
              (istream *stream,string *filepath,bool warningsAsErrors,bool GLTFBasisU,
              function<void_(const_ktx::ValidationReport_&)> *callback)

{
  int iVar1;
  FatalValidationError *anon_var_0;
  ValidationContextIOStream ctx;
  function<void_(const_ktx::ValidationReport_&)> *in_stack_fffffffffffffc18;
  undefined4 in_stack_fffffffffffffc20;
  undefined4 in_stack_fffffffffffffc24;
  string *in_stack_fffffffffffffca0;
  istream *in_stack_fffffffffffffca8;
  function<void_(const_ktx::ValidationReport_&)> *in_stack_fffffffffffffcb0;
  undefined1 in_stack_fffffffffffffcbe;
  undefined1 in_stack_fffffffffffffcbf;
  ValidationContextIOStream *in_stack_fffffffffffffcc0;
  undefined1 in_stack_fffffffffffffd5f;
  ValidationContext *in_stack_fffffffffffffd60;
  
  std::function<void_(const_ktx::ValidationReport_&)>::function
            ((function<void_(const_ktx::ValidationReport_&)> *)
             CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),in_stack_fffffffffffffc18
            );
  ValidationContextIOStream::ValidationContextIOStream
            (in_stack_fffffffffffffcc0,(bool)in_stack_fffffffffffffcbf,
             (bool)in_stack_fffffffffffffcbe,in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
             in_stack_fffffffffffffca0);
  std::function<void_(const_ktx::ValidationReport_&)>::~function
            ((function<void_(const_ktx::ValidationReport_&)> *)0x2b02b3);
  iVar1 = ValidationContext::validate(in_stack_fffffffffffffd60,(bool)in_stack_fffffffffffffd5f);
  ValidationContextIOStream::~ValidationContextIOStream
            ((ValidationContextIOStream *)CONCAT44(iVar1,in_stack_fffffffffffffc20));
  return iVar1;
}

Assistant:

int validateIOStream(std::istream& stream, const std::string& filepath, bool warningsAsErrors, bool GLTFBasisU, std::function<void(const ValidationReport&)> callback) {
    try {
        ValidationContextIOStream ctx{warningsAsErrors, GLTFBasisU, std::move(callback), stream, filepath};
        return ctx.validate();
    } catch (const FatalValidationError&) {
        return +rc::INVALID_FILE;
    }
}